

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseTypeModuleField(WastParser *this,Module *module)

{
  long *plVar1;
  undefined8 uVar2;
  bool bVar3;
  Result RVar4;
  Result RVar5;
  long lVar6;
  allocator<char> local_142;
  allocator<char> local_141;
  undefined1 local_140 [8];
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  string local_108 [32];
  string local_e8 [32];
  string name;
  Location loc;
  BindingHash bindings;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation((Location *)local_128,this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_140);
  RVar4 = Expect(this,Type);
  if (RVar4.enum_ == Error) {
    RVar4.enum_ = Error;
    goto LAB_00155356;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
LAB_00155346:
    RVar4.enum_ = Error;
  }
  else {
    GetLocation(&loc,this);
    bVar3 = Match(this,First_RefKind);
    if (bVar3) {
      std::make_unique<wabt::FuncType,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_buckets =
           &bindings.
            super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
            ._M_h._M_single_bucket;
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_bucket_count = 1;
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_element_count = 0;
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_rehash_policy._M_next_resize = 0;
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_single_bucket = (__node_base_ptr)0x0;
      RVar4 = ParseFuncSignature(this,(FuncSignature *)(local_138._0_8_ + 0x50),&bindings);
      if (RVar4.enum_ == Error) {
LAB_0015548b:
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                       *)&bindings);
        if ((long *)local_138._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_138._0_8_ + 8))();
        }
        goto LAB_00155346;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128[0]._M_local_buf,"param",&local_142);
      std::__cxx11::string::string<std::allocator<char>>(local_108,"result",&local_141);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 local_128,local_e8);
      RVar4 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      lVar6 = 0x20;
      do {
        std::__cxx11::string::_M_dispose();
        uVar2 = local_138._0_8_;
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
      if (RVar4.enum_ == Error) goto LAB_0015548b;
      local_138._0_8_ = (long *)0x0;
      plVar1 = *(long **)((long)local_140 + 0x40);
      *(undefined8 *)((long)local_140 + 0x40) = uVar2;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                     *)&bindings);
      if ((long *)local_138._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
    else {
      bVar3 = Match(this,Struct);
      if (!bVar3) {
        bVar3 = Match(this,Array);
        if (bVar3) {
          if ((this->options_->features).gc_enabled_ == false) {
            Error(this,0x19f1e6);
          }
          std::make_unique<wabt::ArrayType,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
          ;
          RVar4 = ParseField(this,(Field *)(local_128[0]._M_allocated_capacity + 0x50));
          goto LAB_0015555f;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_128[0]._M_local_buf,"func",(allocator<char> *)&local_48);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_108,"struct",(allocator<char> *)local_138);
        std::__cxx11::string::string<std::allocator<char>>(local_e8,"array",&local_142);
        bindings.
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_buckets = (__buckets_ptr)0x0;
        bindings.
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_bucket_count = 0;
        bindings.
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&bindings,
                   local_128,&name);
        RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&bindings,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&bindings);
        lVar6 = 0x40;
        do {
          std::__cxx11::string::_M_dispose();
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != -0x20);
        goto LAB_00155349;
      }
      if ((this->options_->features).gc_enabled_ == false) {
        Error(this,0x196381);
        goto LAB_00155346;
      }
      std::make_unique<wabt::StructType,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      RVar4 = ParseFieldList(this,(vector<wabt::Field,_std::allocator<wabt::Field>_> *)
                                  (local_128[0]._M_allocated_capacity + 0x50));
LAB_0015555f:
      uVar2 = local_128[0]._M_allocated_capacity;
      if (RVar4.enum_ != Error) {
        local_128[0]._M_allocated_capacity = (long *)0x0;
        plVar1 = *(long **)((long)local_140 + 0x40);
        *(undefined8 *)((long)local_140 + 0x40) = uVar2;
        if (plVar1 == (long *)0x0) goto LAB_001555e4;
        (**(code **)(*plVar1 + 8))();
      }
      if ((long *)local_128[0]._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_128[0]._0_8_ + 8))();
      }
      if (RVar4.enum_ == Error) goto LAB_00155346;
    }
LAB_001555e4:
    RVar5 = Expect(this,Rpar);
    RVar4.enum_ = Error;
    if ((RVar5.enum_ != Error) && (RVar5 = Expect(this,Rpar), RVar5.enum_ != Error)) {
      local_138._8_8_ = local_140;
      local_140 = (undefined1  [8])0x0;
      Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                  *)(local_138 + 8));
      if (local_138._8_8_ != 0) {
        (**(code **)(*(long *)local_138._8_8_ + 8))();
      }
      local_138._8_8_ = 0;
      RVar4.enum_ = Ok;
    }
  }
LAB_00155349:
  std::__cxx11::string::_M_dispose();
LAB_00155356:
  if (local_140 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_140 + 8))();
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseTypeModuleField(Module* module) {
  WABT_TRACE(ParseTypeModuleField);
  EXPECT(Lpar);
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  EXPECT(Type);

  std::string name;
  ParseBindVarOpt(&name);
  EXPECT(Lpar);
  Location loc = GetLocation();

  if (Match(TokenType::Func)) {
    auto func_type = std::make_unique<FuncType>(name);
    BindingHash bindings;
    CHECK_RESULT(ParseFuncSignature(&func_type->sig, &bindings));
    CHECK_RESULT(ErrorIfLpar({"param", "result"}));
    field->type = std::move(func_type);
  } else if (Match(TokenType::Struct)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "struct not allowed");
      return Result::Error;
    }
    auto struct_type = std::make_unique<StructType>(name);
    CHECK_RESULT(ParseFieldList(&struct_type->fields));
    field->type = std::move(struct_type);
  } else if (Match(TokenType::Array)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "array type not allowed");
    }
    auto array_type = std::make_unique<ArrayType>(name);
    CHECK_RESULT(ParseField(&array_type->field));
    field->type = std::move(array_type);
  } else {
    return ErrorExpected({"func", "struct", "array"});
  }

  EXPECT(Rpar);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}